

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkClearance.cpp
# Opt level: O3

void __thiscall chrono::ChLinkClearance::UpdateForces(ChLinkClearance *this,double mytime)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ChFrameMoving<double> *this_00;
  ChBodyFrame *pCVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  Vector temp;
  Vector m_V2_abs;
  Vector m_V1_abs;
  ChVector<double> local_128;
  double local_108;
  undefined8 uStack_100;
  Vector local_f8;
  Vector local_d8;
  undefined1 local_b8 [16];
  double local_a8;
  undefined1 local_98 [16];
  double local_88;
  undefined1 local_78 [16];
  double local_68;
  undefined1 local_58 [16];
  double local_48;
  Vector local_38;
  
  local_128.m_data[0] = VNULL;
  local_128.m_data[1] = DAT_00b689a0;
  local_128.m_data[2] = DAT_00b689a8;
  local_108 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.
              react_force.m_data[0];
  uStack_100 = 0;
  if (((*(this->super_ChLinkLockLock).super_ChLinkLock.mask.super_ChLinkMask.constraints.
         super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
         ._M_impl.super__Vector_impl_data._M_start)->super_ChConstraintTwo).super_ChConstraint.
      active == true) {
    Get_contact_P_abs(&local_d8,this);
    this_00 = &((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.Body1
               )->super_ChFrameMoving<double>;
    dVar8 = local_d8.m_data[1] - (this_00->super_ChFrame<double>).coord.pos.m_data[1];
    dVar9 = local_d8.m_data[0] - (this_00->super_ChFrame<double>).coord.pos.m_data[0];
    dVar10 = local_d8.m_data[2] - (this_00->super_ChFrame<double>).coord.pos.m_data[2];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(double *)
                    ((long)(this_00->super_ChFrame<double>).Amatrix.
                           super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 0x10);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar9;
    auVar32._8_8_ = 0;
    auVar32._0_8_ =
         dVar8 * *(double *)
                  ((long)(this_00->super_ChFrame<double>).Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x28);
    auVar1 = vfmadd231sd_fma(auVar32,auVar19,auVar1);
    auVar26._0_8_ =
         dVar8 * *(double *)
                  ((long)(this_00->super_ChFrame<double>).Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x18);
    auVar26._8_8_ =
         dVar8 * *(double *)
                  ((long)(this_00->super_ChFrame<double>).Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x20);
    auVar20._8_8_ = dVar9;
    auVar20._0_8_ = dVar9;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(double *)
                    ((long)(this_00->super_ChFrame<double>).Amatrix.
                           super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 0x40);
    auVar31._8_8_ = 0;
    auVar31._0_8_ = dVar10;
    auVar2 = vfmadd231sd_fma(auVar1,auVar31,auVar2);
    auVar1 = vfmadd132pd_fma(auVar20,auVar26,
                             *(undefined1 (*) [16])
                              (this_00->super_ChFrame<double>).Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array);
    auVar27._8_8_ = dVar10;
    auVar27._0_8_ = dVar10;
    local_58 = vfmadd132pd_fma(auVar27,auVar1,
                               *(undefined1 (*) [16])
                                ((long)(this_00->super_ChFrame<double>).Amatrix.
                                       super_Matrix<double,_3,_3,_1,_3,_3>.
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                       m_storage.m_data.array + 0x30));
    local_48 = auVar2._0_8_;
    pCVar7 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.Body2;
    dVar8 = local_d8.m_data[1] -
            (pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
    dVar9 = local_d8.m_data[0] -
            (pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
    dVar10 = local_d8.m_data[2] -
             (pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(double *)
                    ((long)&(pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data + 0x10);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar9;
    auVar28._8_8_ = 0;
    auVar28._0_8_ =
         dVar8 * *(double *)
                  ((long)&(pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x28);
    auVar1 = vfmadd231sd_fma(auVar28,auVar13,auVar3);
    auVar17._0_8_ =
         dVar8 * *(double *)
                  ((long)&(pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x18);
    auVar17._8_8_ =
         dVar8 * *(double *)
                  ((long)&(pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x20);
    auVar14._8_8_ = dVar9;
    auVar14._0_8_ = dVar9;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(double *)
                    ((long)&(pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data + 0x40);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = dVar10;
    auVar2 = vfmadd231sd_fma(auVar1,auVar21,auVar4);
    auVar1 = vfmadd132pd_fma(auVar14,auVar17,
                             *(undefined1 (*) [16])
                              (pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array);
    auVar18._8_8_ = dVar10;
    auVar18._0_8_ = dVar10;
    local_78 = vfmadd132pd_fma(auVar18,auVar1,
                               *(undefined1 (*) [16])
                                ((long)&(pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.
                                        Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                        .m_storage.m_data + 0x30));
    local_68 = auVar2._0_8_;
    ChFrameMoving<double>::PointSpeedLocalToParent(this_00,(ChVector<double> *)local_58);
    ChFrameMoving<double>::PointSpeedLocalToParent
              (&((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.
                Body2)->super_ChFrameMoving<double>,(ChVector<double> *)local_78);
    auVar1 = vsubpd_avx(local_98,local_b8);
    *(undefined1 (*) [16])(this->contact_V_abs).m_data = auVar1;
    (this->contact_V_abs).m_data[2] = local_88 - local_a8;
    Get_contact_N_abs(&local_f8,this);
    Get_contact_N_abs(&local_38,this);
    dVar8 = (this->contact_V_abs).m_data[1];
    dVar9 = (this->contact_V_abs).m_data[0];
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar9;
    dVar10 = (this->contact_V_abs).m_data[2];
    auVar29._8_8_ = 0;
    auVar29._0_8_ = dVar10;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_38.m_data[0];
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar8 * local_38.m_data[1];
    auVar1 = vfmadd231sd_fma(auVar22,auVar15,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_38.m_data[2];
    auVar1 = vfmadd231sd_fma(auVar1,auVar29,auVar6);
    dVar25 = auVar1._0_8_;
    dVar8 = dVar8 - dVar25 * local_f8.m_data[1];
    dVar9 = dVar9 - dVar25 * local_f8.m_data[0];
    dVar10 = dVar10 - dVar25 * local_f8.m_data[2];
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar9;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = dVar8 * dVar8;
    auVar1 = vfmadd231sd_fma(auVar30,auVar16,auVar16);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar10;
    auVar1 = vfmadd231sd_fma(auVar1,auVar23,auVar23);
    auVar1 = vsqrtsd_avx(auVar1,auVar1);
    bVar11 = 2.2250738585072014e-308 <= auVar1._0_8_;
    dVar25 = 1.0 / auVar1._0_8_;
    local_128.m_data[2] = local_108 * this->c_friction;
    local_128.m_data[0] =
         local_128.m_data[2] *
         (double)((ulong)bVar11 * (long)(dVar9 * dVar25) + (ulong)!bVar11 * 0x3ff0000000000000);
    local_128.m_data[1] = local_128.m_data[2] * (double)((ulong)bVar11 * (long)(dVar8 * dVar25));
    local_128.m_data[2] = local_128.m_data[2] * (double)((ulong)bVar11 * (long)(dVar10 * dVar25));
    ChMarker::Dir_World2Ref
              (&local_f8,(this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2,
               &local_128);
    dVar8 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.C_force.m_data[1];
    (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.C_force.m_data[0] =
         local_f8.m_data[0] +
         (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.C_force.m_data[0];
    (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.C_force.m_data[1] =
         local_f8.m_data[1] + dVar8;
    (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.C_force.m_data[2] =
         local_f8.m_data[2] +
         (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.C_force.m_data[2];
  }
  Get_contact_N_abs(&local_d8,this);
  auVar24._0_8_ = local_108 * local_d8.m_data[0];
  auVar24._8_8_ = local_108 * local_d8.m_data[1];
  auVar12._8_8_ = local_128.m_data[1];
  auVar12._0_8_ = local_128.m_data[0];
  auVar1 = vsubpd_avx(auVar12,auVar24);
  *(undefined1 (*) [16])(this->contact_F_abs).m_data = auVar1;
  (this->contact_F_abs).m_data[2] = local_128.m_data[2] - local_108 * local_d8.m_data[2];
  return;
}

Assistant:

void ChLinkClearance::UpdateForces(double mytime) {
    // May avoid inheriting parent class force computation, since not
    // needed...
    // LinkLock::UpdateForces(mytime);

    Vector m_friction_F_abs = VNULL;
    double m_norm_force = -this->react_force.x();

    // Just add Coulomb kinematic friction...

    if (mask.Constr_X().IsActive()) {
        Vector temp = Get_contact_P_abs();
        Vector pb1 = ((ChFrame<double>*)Body1)->TransformParentToLocal(temp);
        Vector pb2 = ((ChFrame<double>*)Body2)->TransformParentToLocal(temp);
        Vector m_V1_abs = Body1->PointSpeedLocalToParent(pb1);
        Vector m_V2_abs = Body2->PointSpeedLocalToParent(pb2);
        this->contact_V_abs = Vsub(m_V1_abs, m_V2_abs);
        Vector m_tang_V_abs = Vsub(contact_V_abs, Vmul(Get_contact_N_abs(), Vdot(contact_V_abs, Get_contact_N_abs())));

        // absolute friction force, as applied in contact point
        m_friction_F_abs = Vmul(Vnorm(m_tang_V_abs), Get_c_friction() * (-m_norm_force));

        // transform the friction force in link master coords ***TO CHECK*** (new version!)
        this->C_force += this->marker2->Dir_World2Ref(m_friction_F_abs);
    }

    // update internal data: the abs. vector of all contact forces, is a sum of reaction and friction
    this->contact_F_abs = Vadd(Vmul(Get_contact_N_abs(), m_norm_force), m_friction_F_abs);
}